

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL12_compat.c
# Opt level: O1

void SDL_GL_UpdateRects(int numrects,SDL12_Rect *rects12)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  GLenum GVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  SDL_Rect intersected20;
  SDL_Rect rect20;
  SDL_Rect surfacerect20;
  
  if (OpenGLBlitTexture != 0) {
    uVar7 = (ulong)VideoSurface12Location.pitch;
    bVar1 = (VideoSurface12Location.format)->BytesPerPixel;
    GVar8 = 0x8363;
    if (bVar1 == 4) {
      GVar8 = 0x1401;
    }
    surfacerect20.x = 0;
    surfacerect20.y = 0;
    surfacerect20.h = VideoSurface12Location.h;
    surfacerect20.w = VideoSurface12Location.w;
    if (0 < numrects) {
      uVar4 = 0;
      do {
        rect20.x = (int)rects12[uVar4].x;
        rect20.y = (int)rects12[uVar4].y;
        rect20.w = (int)rects12[uVar4].w;
        rect20.h = (int)rects12[uVar4].h;
        (*SDL20_IntersectRect)(&rect20,&surfacerect20,&intersected20);
        (*OpenGLFuncs.glTexSubImage2D)
                  (0xde1,0,intersected20.x,intersected20.y,intersected20.w,intersected20.h,
                   (bVar1 == 4) + 0x1907,GVar8,
                   (GLvoid *)
                   ((long)VideoSurface12Location.pixels +
                   (long)(int)(intersected20.x * (uint)bVar1) + (long)intersected20.y * uVar7));
        (*OpenGLFuncs.glBegin)(5);
        iVar3 = intersected20.y;
        iVar2 = intersected20.x;
        fVar10 = (float)intersected20.x / (float)VideoSurface12Location.w;
        fVar12 = (float)intersected20.y / (float)VideoSurface12Location.h;
        fVar11 = (float)intersected20.w / (float)VideoSurface12Location.w + fVar10;
        fVar9 = (float)intersected20.h / (float)VideoSurface12Location.h + fVar12;
        iVar5 = intersected20.w + intersected20.x;
        iVar6 = intersected20.h + intersected20.y;
        (*OpenGLFuncs.glTexCoord2f)(fVar10,fVar12);
        (*OpenGLFuncs.glVertex2i)(iVar2,iVar3);
        (*OpenGLFuncs.glTexCoord2f)(fVar11,fVar12);
        (*OpenGLFuncs.glVertex2i)(iVar5,iVar3);
        (*OpenGLFuncs.glTexCoord2f)(fVar10,fVar9);
        (*OpenGLFuncs.glVertex2i)(iVar2,iVar6);
        (*OpenGLFuncs.glTexCoord2f)(fVar11,fVar9);
        (*OpenGLFuncs.glVertex2i)(iVar5,iVar6);
        (*OpenGLFuncs.glEnd)();
        uVar4 = uVar4 + 1;
      } while ((uint)numrects != uVar4);
    }
  }
  return;
}

Assistant:

SDLCALL
SDL_GL_UpdateRects(int numrects, SDL12_Rect *rects12)
{
    if (OpenGLBlitTexture) {
        const int srcpitch = VideoSurface12->pitch;
        const int pixsize = VideoSurface12->format->BytesPerPixel;
        const GLenum glfmt = (pixsize == 4) ? GL_RGBA : GL_RGB;
        const GLenum gltype = (pixsize == 4) ? GL_UNSIGNED_BYTE : GL_UNSIGNED_SHORT_5_6_5;
        SDL_Rect surfacerect20;
        int i;

        surfacerect20.x = surfacerect20.y = 0;
        surfacerect20.w = VideoSurface12->w;
        surfacerect20.h = VideoSurface12->h;

        for (i = 0; i < numrects; i++) {
            SDL_Rect rect20;
            SDL_Rect intersected20;
            Uint8 *src;

            SDL20_IntersectRect(Rect12to20(&rects12[i], &rect20), &surfacerect20, &intersected20);

            src = (((Uint8 *) VideoSurface12->pixels) + (intersected20.y * srcpitch)) + (intersected20.x * pixsize);
            OpenGLFuncs.glTexSubImage2D(GL_TEXTURE_2D, 0, intersected20.x, intersected20.y, intersected20.w, intersected20.h, glfmt, gltype, src);

            OpenGLFuncs.glBegin(GL_TRIANGLE_STRIP);
            {
                const GLfloat tex_x1 = ((GLfloat) intersected20.x) / ((GLfloat) VideoSurface12->w);
                const GLfloat tex_y1 = ((GLfloat) intersected20.y) / ((GLfloat) VideoSurface12->h);
                const GLfloat tex_x2 = tex_x1 + ((GLfloat) intersected20.w) / ((GLfloat) VideoSurface12->w);
                const GLfloat tex_y2 = tex_y1 + ((GLfloat) intersected20.h) / ((GLfloat) VideoSurface12->h);
                const GLint vert_x1 = (GLint) intersected20.x;
                const GLint vert_y1 = (GLint) intersected20.y;
                const GLint vert_x2 = vert_x1 + (GLint) intersected20.w;
                const GLint vert_y2 = vert_y1 + (GLint) intersected20.h;
                OpenGLFuncs.glTexCoord2f(tex_x1, tex_y1);
                OpenGLFuncs.glVertex2i(vert_x1, vert_y1);
                OpenGLFuncs.glTexCoord2f(tex_x2, tex_y1);
                OpenGLFuncs.glVertex2i(vert_x2, vert_y1);
                OpenGLFuncs.glTexCoord2f(tex_x1, tex_y2);
                OpenGLFuncs.glVertex2i(vert_x1, vert_y2);
                OpenGLFuncs.glTexCoord2f(tex_x2, tex_y2);
                OpenGLFuncs.glVertex2i(vert_x2, vert_y2);
            }
            OpenGLFuncs.glEnd();
        }
    }
}